

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strrchr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *pcVar2;
  char *zPattern;
  sxi32 rc;
  sxu32 nOfft;
  int c;
  int nLen;
  char *zBlob;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zBlob = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_bool(pCtx,0);
  }
  else {
    _c = jx9_value_to_string(*apArg,(int *)&nOfft);
    rc = 0;
    if ((int)nOfft < 1) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      iVar1 = jx9_value_is_string(*(jx9_value **)(zBlob + 8));
      if (iVar1 == 0) {
        rc = jx9_value_to_int(*(jx9_value **)(zBlob + 8));
      }
      else {
        pcVar2 = jx9_value_to_string(*(jx9_value **)(zBlob + 8),(int *)0x0);
        rc = (sxi32)*pcVar2;
      }
      zPattern._0_4_ = SyByteFind2(_c,nOfft,rc,(sxu32 *)((long)&zPattern + 4));
      if ((sxi32)zPattern == 0) {
        jx9_result_string(pjStack_18,_c + zPattern._4_4_,nOfft - zPattern._4_4_);
      }
      else {
        jx9_result_bool(pjStack_18,0);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strrchr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zBlob;
	int nLen, c;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	c = 0; /* cc warning */
	if( nLen > 0 ){
		sxu32 nOfft;
		sxi32 rc;
		if( jx9_value_is_string(apArg[1]) ){
			const char *zPattern;
			zPattern = jx9_value_to_string(apArg[1], 0); /* Never fail, so there is no need to check
														 * for NULL pointer.
														 */
			c = zPattern[0];
		}else{
			/* Int cast */
			c = jx9_value_to_int(apArg[1]);
		}
		/* Perform the lookup */
		rc = SyByteFind2(zBlob, (sxu32)nLen, c, &nOfft);
		if( rc != SXRET_OK ){
			/* No such entry, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the string portion */
		jx9_result_string(pCtx, &zBlob[nOfft], (int)(&zBlob[nLen]-&zBlob[nOfft]));
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}